

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<capnp::LocalRequest> __thiscall
kj::
heap<capnp::LocalRequest,unsigned_long&,unsigned_short&,kj::Maybe<capnp::MessageSize>&,kj::Own<capnp::LocalClient>>
          (kj *this,unsigned_long *params,unsigned_short *params_1,
          Maybe<capnp::MessageSize> *params_2,Own<capnp::LocalClient> *params_3)

{
  uint16_t methodId;
  uint64_t interfaceId;
  LocalRequest *this_00;
  LocalRequest *extraout_RDX;
  Own<capnp::LocalRequest> OVar1;
  Own<capnp::ClientHook> local_58;
  Maybe<capnp::MessageSize> local_48;
  
  this_00 = (LocalRequest *)operator_new(0x38);
  interfaceId = *params;
  methodId = *params_1;
  local_48.ptr.isSet = (params_2->ptr).isSet;
  if (local_48.ptr.isSet == true) {
    local_48.ptr.field_1.value.wordCount = (params_2->ptr).field_1.value.wordCount;
    local_48.ptr.field_1._8_8_ = *(undefined8 *)((long)&(params_2->ptr).field_1 + 8);
  }
  local_58.disposer = params_3->disposer;
  local_58.ptr = &params_3->ptr->super_ClientHook;
  params_3->ptr = (LocalClient *)0x0;
  capnp::LocalRequest::LocalRequest(this_00,interfaceId,methodId,&local_48,&local_58);
  *(undefined8 **)this = &_::HeapDisposer<capnp::LocalRequest>::instance;
  *(LocalRequest **)(this + 8) = this_00;
  Own<capnp::ClientHook>::dispose(&local_58);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}